

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteDataSegment(WatWriter *this,DataSegment *segment)

{
  uchar *data;
  size_type length;
  string_view local_28;
  DataSegment *local_18;
  DataSegment *segment_local;
  WatWriter *this_local;
  
  local_18 = segment;
  segment_local = (DataSegment *)this;
  WriteOpenSpace(this,"data");
  string_view::string_view(&local_28,&local_18->name);
  WriteNameOrIndex(this,local_28,this->data_segment_index_,Space);
  if (local_18->kind != Passive) {
    WriteInitExpr(this,&local_18->offset);
  }
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&local_18->data);
  length = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_18->data);
  WriteQuotedData(this,data,length);
  WriteCloseNewline(this);
  this->data_segment_index_ = this->data_segment_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteDataSegment(const DataSegment& segment) {
  WriteOpenSpace("data");
  WriteNameOrIndex(segment.name, data_segment_index_, NextChar::Space);
  if (segment.kind != SegmentKind::Passive) {
    WriteInitExpr(segment.offset);
  }
  WriteQuotedData(segment.data.data(), segment.data.size());
  WriteCloseNewline();
  data_segment_index_++;
}